

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_3_method_postfix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_ATKEY,G->val[-5],G->val[-4]);
  G->ss = pPVar1;
  G->val[-5] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_3_method_postfix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
#define f3 G->val[-2]
#define f2 G->val[-3]
#define k G->val[-4]
#define f1 G->val[-5]
  yyprintf((stderr, "do yy_3_method_postfix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_ATKEY, f1, k); f1=yy; }\n"));
  yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_ATKEY, f1, k); f1=yy; ;
#undef a
#undef f3
#undef f2
#undef k
#undef f1
}